

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

BinaryOperator * __thiscall
soul::heart::Parser::parseBinaryOp(Parser *this,FunctionParseState *state,Op opType)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Module *this_00;
  BinaryOperator *pBVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_1a8;
  string local_188;
  char *local_168;
  CompileMessage local_160;
  undefined1 local_128 [8];
  BinaryOperatorTypes binOpTypes;
  Type *operandType;
  string local_d0;
  char *local_b0;
  CompileMessage local_a8;
  Structure *local_70;
  Type *lhsType;
  Expression *local_60;
  Expression *rhs;
  Expression *local_50;
  Expression *lhs;
  char *local_38;
  undefined1 local_30 [8];
  CodeLocation pos;
  Op opType_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  pos.location.data._4_4_ = opType;
  CodeLocation::CodeLocation
            ((CodeLocation *)local_30,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  local_38 = "(";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x573c42);
  local_50 = parseExpression(this,state);
  rhs = (Expression *)anon_var_dwarf_10ee90;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)",");
  local_60 = parseExpression(this,state);
  lhsType = (Type *)0x571824;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x571824);
  iVar2 = (*(local_50->super_Object)._vptr_Object[2])();
  local_70 = (Structure *)CONCAT44(extraout_var,iVar2);
  iVar3 = (*(local_60->super_Object)._vptr_Object[2])();
  bVar1 = Type::isEqual((Type *)CONCAT44(extraout_var,iVar2),(Type *)CONCAT44(extraout_var_00,iVar3)
                        ,1);
  if (!bVar1) {
    local_b0 = BinaryOp::getSymbol(pos.location.data._4_4_);
    iVar2 = (*(local_50->super_Object)._vptr_Object[2])();
    Type::getDescription_abi_cxx11_(&local_d0,(Type *)CONCAT44(extraout_var_01,iVar2));
    iVar2 = (*(local_60->super_Object)._vptr_Object[2])();
    Type::getDescription_abi_cxx11_((string *)&operandType,(Type *)CONCAT44(extraout_var_02,iVar2));
    Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
              (&local_a8,(Errors *)&local_b0,(char **)&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&operandType,
               in_R8);
    CodeLocation::throwError((CodeLocation *)local_30,&local_a8);
  }
  binOpTypes.operandType.structure.object = local_70;
  BinaryOp::getTypes((BinaryOperatorTypes *)local_128,pos.location.data._4_4_,(Type *)local_70,
                     (Type *)local_70);
  bVar1 = Type::isEqual((Type *)&binOpTypes.resultType.structure,
                        (Type *)binOpTypes.operandType.structure.object,1);
  if (!bVar1) {
    local_168 = BinaryOp::getSymbol(pos.location.data._4_4_);
    iVar2 = (*(local_50->super_Object)._vptr_Object[2])();
    Type::getDescription_abi_cxx11_(&local_188,(Type *)CONCAT44(extraout_var_03,iVar2));
    iVar2 = (*(local_60->super_Object)._vptr_Object[2])();
    Type::getDescription_abi_cxx11_(&local_1a8,(Type *)CONCAT44(extraout_var_04,iVar2));
    Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
              (&local_160,(Errors *)&local_168,(char **)&local_188,&local_1a8,in_R8);
    CodeLocation::throwError((CodeLocation *)local_30,&local_160);
  }
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  pBVar4 = Module::
           allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                     (this_00,(CodeLocation *)local_30,local_50,local_60,
                      (Op *)((long)&pos.location.data + 4));
  TypeRules::BinaryOperatorTypes::~BinaryOperatorTypes((BinaryOperatorTypes *)local_128);
  CodeLocation::~CodeLocation((CodeLocation *)local_30);
  return pBVar4;
}

Assistant:

heart::BinaryOperator& parseBinaryOp (const FunctionParseState& state, BinaryOp::Op opType)
    {
        auto pos = location;
        expect (HEARTOperator::openParen);
        auto& lhs = parseExpression (state);
        expect (HEARTOperator::comma);
        auto& rhs = parseExpression (state);
        expect (HEARTOperator::closeParen);
        const auto& lhsType = lhs.getType();

        if (! lhsType.isEqual (rhs.getType(), Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        const auto& operandType = lhsType;
        auto binOpTypes = BinaryOp::getTypes (opType, operandType, operandType);

        if (! binOpTypes.operandType.isEqual (operandType, Type::ignoreReferences))
            pos.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (opType),
                                                                   lhs.getType().getDescription(),
                                                                   rhs.getType().getDescription()));

        return module->allocate<heart::BinaryOperator> (pos, lhs, rhs, opType);
    }